

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_prng.cpp
# Opt level: O2

void __thiscall Kumu::FortunaRNG::FortunaRNG(FortunaRNG *this)

{
  Mutex *__mutex;
  h__RNG *this_00;
  ILogSink *this_01;
  ui32_t read_count;
  FileReader URandom;
  Result_t result;
  byte_t rng_key [512];
  allocator<char> local_31c [4];
  FileReader local_318;
  Result_t local_2e8;
  Result_t local_280;
  byte_t local_218 [512];
  
  if (s_RNG != (h__RNG *)0x0) {
    return;
  }
  this_00 = (h__RNG *)operator_new(0xe8);
  __mutex = &this_00->m_Lock;
  Mutex::Mutex(__mutex);
  this_00->m_ctr_buf[0] = '\0';
  this_00->m_ctr_buf[1] = '\0';
  this_00->m_ctr_buf[2] = '\0';
  this_00->m_ctr_buf[3] = '\0';
  this_00->m_ctr_buf[4] = '\0';
  this_00->m_ctr_buf[5] = '\0';
  this_00->m_ctr_buf[6] = '\0';
  this_00->m_ctr_buf[7] = '\0';
  this_00->m_ctr_buf[8] = '\0';
  this_00->m_ctr_buf[9] = '\0';
  this_00->m_ctr_buf[10] = '\0';
  this_00->m_ctr_buf[0xb] = '\0';
  this_00->m_ctr_buf[0xc] = '\0';
  this_00->m_ctr_buf[0xd] = '\0';
  this_00->m_ctr_buf[0xe] = '\0';
  this_00->m_ctr_buf[0xf] = '\0';
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  FileReader::FileReader(&local_318);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"/dev/urandom",local_31c);
  FileReader::OpenRead(&local_280,&local_318,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  if (-1 < local_280.value) {
    FileReader::Read(&local_2e8,&local_318,local_218,0x200,(ui32_t *)local_31c);
    Result_t::operator=(&local_280,&local_2e8);
    Result_t::~Result_t(&local_2e8);
    if (-1 < local_280.value) goto LAB_001184a3;
  }
  this_01 = DefaultLogSink();
  ILogSink::Error(this_01,"Error opening random device: %s\n","/dev/urandom");
LAB_001184a3:
  Result_t::~Result_t(&local_280);
  FileReader::~FileReader(&local_318);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  anon_unknown.dwarf_21baf::h__RNG::set_key(this_00,local_218);
  s_RNG = this_00;
  return;
}

Assistant:

Kumu::FortunaRNG::FortunaRNG()
{
  if ( s_RNG == 0 )
    s_RNG = new h__RNG;
}